

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Id __thiscall dxil_spv::Converter::Impl::get_type_id(Impl *this,Type *type,TypeLayoutFlags flags)

{
  pointer *ppAVar1;
  pointer pAVar2;
  pointer pAVar3;
  iterator __position;
  pointer pAVar4;
  pointer pAVar5;
  TypeID TVar6;
  Id type_id;
  uint uVar7;
  Id IVar8;
  Id IVar9;
  uint uVar10;
  Builder *this_00;
  uint64_t uVar11;
  StructType *this_01;
  VectorType *this_02;
  Type *pTVar12;
  SizeAlignment SVar13;
  LoggingCallback p_Var14;
  void *pvVar15;
  pointer pAVar16;
  int width;
  bool bVar17;
  Vector<spv::Id> member_types;
  Id local_103c;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_1038 [171];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  TVar6 = LLVMBC::Type::getTypeID(type);
  IVar9 = 0;
  IVar8 = 0;
  switch(TVar6) {
  case HalfTyID:
    width = ((byte)~((this->options).min_precision_prefer_native_16bit |
                    (this->execution_mode_meta).native_16bit_operations) & 1) * 0x10 + 0x10;
    break;
  case FloatTyID:
    width = 0x20;
    break;
  case DoubleTyID:
    width = 0x40;
    break;
  case IntegerTyID:
    uVar10 = LLVMBC::Type::getIntegerBitWidth(type);
    if (uVar10 == 1) {
      IVar9 = spv::Builder::makeBoolType(this_00);
      return IVar9;
    }
    uVar10 = LLVMBC::Type::getIntegerBitWidth(type);
    uVar10 = physical_integer_bit_width(uVar10);
    IVar9 = spv::Builder::makeIntegerType(this_00,uVar10,false);
    return IVar9;
  case PointerTyID:
    uVar10 = LLVMBC::Type::getPointerAddressSpace(type);
    if (((flags & 1) != 0) && ((uVar10 & 0xff) == 6)) {
      pTVar12 = LLVMBC::Type::getPointerElementType(type);
      IVar9 = get_type_id(this,pTVar12,flags);
      IVar9 = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,IVar9);
      return IVar9;
    }
    p_Var14 = get_thread_log_callback();
    if (p_Var14 == (LoggingCallback)0x0) {
      get_type_id();
      std::terminate();
    }
    memcpy(local_1038,
           "Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n"
           ,0x62);
    pvVar15 = get_thread_log_callback_userdata();
    (*p_Var14)(pvVar15,Error,(char *)local_1038);
    std::terminate();
  case ArrayTyID:
    uVar11 = LLVMBC::Type::getArrayNumElements(type);
    if (uVar11 == 0) {
      return 0;
    }
    if ((flags & 1) == 0) {
      pTVar12 = LLVMBC::Type::getArrayElementType(type);
      TVar6 = LLVMBC::Type::getTypeID(pTVar12);
      if (TVar6 == IntegerTyID) {
        pTVar12 = LLVMBC::Type::getArrayElementType(type);
        uVar10 = LLVMBC::Type::getIntegerBitWidth(pTVar12);
        if ((uVar10 == 8) && (uVar11 = LLVMBC::Type::getArrayNumElements(type), (uVar11 & 3) == 0))
        {
          uVar11 = LLVMBC::Type::getArrayNumElements(type);
          IVar8 = spv::Builder::makeUintConstant(this_00,(uint)(uVar11 >> 2),false);
          type_id = spv::Builder::makeIntegerType(this_00,0x20,false);
          goto LAB_0011bc63;
        }
      }
    }
    uVar11 = LLVMBC::Type::getArrayNumElements(type);
    IVar8 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar8 = spv::Builder::makeIntConstant(this_00,IVar8,(uint)uVar11,false);
    pTVar12 = LLVMBC::Type::getArrayElementType(type);
    type_id = get_type_id(this,pTVar12,flags & 0xfffffff7);
LAB_0011bc63:
    if ((flags & 1) == 0) {
      IVar9 = spv::Builder::makeArrayType(this_00,type_id,IVar8,0);
      return IVar9;
    }
    SVar13 = get_physical_size_for_type(this,type_id);
    pAVar2 = (this->cached_physical_array_types).
             super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (this->cached_physical_array_types).
             super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar17 = pAVar2 == pAVar3;
    if ((!bVar17) &&
       (IVar9 = pAVar2->id, pAVar2->array_size_id != IVar8 || pAVar2->element_type_id != type_id)) {
      do {
        pAVar16 = pAVar2 + 1;
        bVar17 = pAVar16 == pAVar3;
        if (bVar17) goto LAB_0011bee7;
        pAVar4 = pAVar2 + 1;
        pAVar5 = pAVar2 + 1;
        pAVar2 = pAVar16;
      } while (pAVar5->array_size_id != IVar8 || pAVar4->element_type_id != type_id);
      IVar9 = pAVar16->id;
    }
LAB_0011bee7:
    if (!bVar17) {
      return IVar9;
    }
    IVar9 = spv::Builder::makeArrayType(this_00,type_id,IVar8,SVar13.size);
    spv::Builder::addDecoration(this_00,IVar9,DecorationArrayStride,SVar13.size);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(type_id,IVar9);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_1038[0].
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,IVar8);
    __position._M_current =
         (this->cached_physical_array_types).
         super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->cached_physical_array_types).
        super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      (__position._M_current)->array_size_id = IVar8;
      *(pointer *)__position._M_current =
           local_1038[0].
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      ppAVar1 = &(this->cached_physical_array_types).
                 super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
      return IVar9;
    }
    std::
    vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
    ::_M_realloc_insert<dxil_spv::Converter::Impl::ArrayTypeEntry>
              (&this->cached_physical_array_types,__position,(ArrayTypeEntry *)local_1038);
    return IVar9;
  case StructTyID:
    this_01 = LLVMBC::cast<LLVMBC::StructType>(type);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    uVar10 = LLVMBC::Type::getStructNumElements(&this_01->super_Type);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
              (local_1038,(ulong)uVar10);
    uVar10 = LLVMBC::Type::getStructNumElements(&this_01->super_Type);
    if (uVar10 != 0) {
      uVar10 = 0;
      do {
        pTVar12 = LLVMBC::Type::getStructElementType(&this_01->super_Type,uVar10);
        local_103c = get_type_id(this,pTVar12,flags & 0xfffffff7);
        if (local_1038[0].
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1038[0].
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
          _M_realloc_insert<unsigned_int>
                    (local_1038,
                     (iterator)
                     local_1038[0].
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_103c);
        }
        else {
          *local_1038[0].
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_103c;
          local_1038[0].
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1038[0].
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar10 = uVar10 + 1;
        uVar7 = LLVMBC::Type::getStructNumElements(&this_01->super_Type);
      } while (uVar10 < uVar7);
    }
    IVar8 = get_struct_type(this,local_1038,flags,"");
    if (local_1038[0].
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(local_1038[0].
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
  default:
    return IVar8;
  case VectorTyID:
    this_02 = LLVMBC::cast<LLVMBC::VectorType>(type);
    pTVar12 = LLVMBC::VectorType::getElementType(this_02);
    IVar9 = get_type_id(this,pTVar12,0);
    uVar10 = LLVMBC::Type::getVectorNumElements(&this_02->super_Type);
    IVar9 = spv::Builder::makeVectorType(this_00,IVar9,uVar10);
    return IVar9;
  }
  IVar9 = spv::Builder::makeFloatType(this_00,width);
  return IVar9;
}

Assistant:

spv::Id Converter::Impl::get_type_id(const llvm::Type *type, TypeLayoutFlags flags)
{
	auto &builder = spirv_module.get_builder();
	switch (type->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		return builder.makeFloatType(support_native_fp16_operations() ? 16 : 32);
	case llvm::Type::TypeID::FloatTyID:
		return builder.makeFloatType(32);
	case llvm::Type::TypeID::DoubleTyID:
		return builder.makeFloatType(64);

	case llvm::Type::TypeID::IntegerTyID:
		if (type->getIntegerBitWidth() == 1)
			return builder.makeBoolType();
		else
		{
			auto width = physical_integer_bit_width(type->getIntegerBitWidth());
			return builder.makeIntegerType(width, false);
		}

	case llvm::Type::TypeID::PointerTyID:
	{
		if (DXIL::AddressSpace(type->getPointerAddressSpace()) != DXIL::AddressSpace::PhysicalNodeIO ||
		    (flags & TYPE_LAYOUT_PHYSICAL_BIT) == 0)
		{
			// Have to deal with this from the outside. Should only be relevant for getelementptr and instructions like that.
			LOGE("Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n");
			std::terminate();
		}

		// This is free-flowing BDA in DXIL. We'll deal with it as-is.
		// Main complication is that we have to emit Offset information ourselves.
		spv::Id pointee_type = get_type_id(type->getPointerElementType(), flags);
		return builder.makePointer(spv::StorageClassPhysicalStorageBuffer, pointee_type);
	}

	case llvm::Type::TypeID::ArrayTyID:
	{
		if (type->getArrayNumElements() == 0)
			return 0;

		spv::Id array_size_id;
		spv::Id element_type_id;

		// dxbc2dxil emits broken code for TGSM. It's an array of i8 which is absolute nonsense.
		// It then bitcasts the pointer to i32, which isn't legal either.
		if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) == 0 &&
		    type->getArrayElementType()->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		    type->getArrayElementType()->getIntegerBitWidth() == 8 &&
		    type->getArrayNumElements() % 4 == 0)
		{
			array_size_id = builder.makeUintConstant(type->getArrayNumElements() / 4);
			element_type_id = builder.makeUintType(32);
		}
		else
		{
			array_size_id = builder.makeUintConstant(type->getArrayNumElements());
			element_type_id = get_type_id(type->getArrayElementType(), flags & ~TYPE_LAYOUT_BLOCK_BIT);
		}

		if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) != 0)
		{
			auto size_stride = get_physical_size_for_type(element_type_id);
			uint32_t stride = size_stride.size;

			// We always use scalar layout.
			for (auto &cached_type : cached_physical_array_types)
				if (cached_type.element_type_id == element_type_id && cached_type.array_size_id == array_size_id)
					return cached_type.id;

			spv::Id array_type_id = builder.makeArrayType(element_type_id, array_size_id, stride);
			builder.addDecoration(array_type_id, spv::DecorationArrayStride, stride);
			cached_physical_array_types.push_back({ array_type_id, element_type_id, array_size_id });
			return array_type_id;
		}
		else
		{
			// glslang emitter deduplicates.
			return builder.makeArrayType(element_type_id, array_size_id, 0);
		}
	}

	case llvm::Type::TypeID::StructTyID:
	{
		auto *struct_type = llvm::cast<llvm::StructType>(type);
		Vector<spv::Id> member_types;
		member_types.reserve(struct_type->getStructNumElements());
		for (unsigned i = 0; i < struct_type->getStructNumElements(); i++)
			member_types.push_back(get_type_id(struct_type->getStructElementType(i), flags & ~TYPE_LAYOUT_BLOCK_BIT));
		return get_struct_type(member_types, flags, "");
	}

	case llvm::Type::TypeID::VectorTyID:
	{
		auto *vec_type = llvm::cast<llvm::VectorType>(type);
		return builder.makeVectorType(get_type_id(vec_type->getElementType()), vec_type->getVectorNumElements());
	}

	default:
		return 0;
	}
}